

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,Savepoint *savepoint,string *fieldName,offset_t offset,
          checksum_t *checksum)

{
  bool bVar1;
  ostream *poVar2;
  SerializationException *this_00;
  pointer ppVar3;
  string local_240;
  undefined1 local_220 [8];
  SerializationException exception;
  ostringstream local_1c8 [8];
  ostringstream msg;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_> local_38;
  const_iterator iter;
  checksum_t *checksum_local;
  offset_t offset_local;
  string *fieldName_local;
  Savepoint *savepoint_local;
  OffsetTable *this_local;
  
  iter._M_node = (_Base_ptr)checksum;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::find(&this->savepointIndex_,savepoint);
  std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::_Rb_tree_const_iterator
            (&local_38,&local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::end(&this->savepointIndex_);
  std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::_Rb_tree_const_iterator
            (&local_48,&local_50);
  bVar1 = std::operator==(&local_38,&local_48);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::operator->
                       (&local_38);
    AddFieldRecord(this,ppVar3->second,fieldName,offset,(checksum_t *)iter._M_node);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar2 = std::operator<<((ostream *)local_1c8,"Error: savepoint ");
  Savepoint::ToString_abi_cxx11_((string *)((long)&exception.message_.field_2 + 8),savepoint);
  poVar2 = std::operator<<(poVar2,(string *)(exception.message_.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2," is not registered in table\n");
  poVar2 = std::operator<<(poVar2,"Saving the field ");
  poVar2 = std::operator<<(poVar2,(string *)fieldName);
  poVar2 = std::operator<<(poVar2," at offset ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,offset);
  std::operator<<(poVar2," is not possible\n");
  std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
  SerializationException::SerializationException((SerializationException *)local_220);
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_220);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void OffsetTable::AddFieldRecord(const Savepoint& savepoint, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    AddFieldRecord(iter->second, fieldName, offset, checksum);
}